

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metainformation.cpp
# Opt level: O2

void __thiscall
hbm::streaming::MetaInformation::MetaInformation
          (MetaInformation *this,SocketNonblocking *socket,size_t size)

{
  pointer pBlock;
  bool bVar1;
  ostream *poVar2;
  size_type __new_size;
  int32_t typeBig;
  vector<char,_std::allocator<char>_> data;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  string local_158;
  Reader reader;
  
  this->m_type = 0;
  Json::Value::Value(&this->m_jsonContent,nullValue);
  (this->m_binaryContent).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_binaryContent).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_binaryContent).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (size < 5) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"MetaInformation");
    poVar2 = std::operator<<(poVar2,": invalid size");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    SocketNonblocking::receiveComplete(socket,&typeBig,4);
    this->m_type = (uint)typeBig >> 0x18 | (typeBig & 0xff0000U) >> 8 | (typeBig & 0xff00U) << 8 |
                   typeBig << 0x18;
    __new_size = size - 4;
    if (typeBig == 0x1000000) {
      std::vector<char,_std::allocator<char>_>::vector(&data,__new_size,(allocator_type *)&reader);
      SocketNonblocking::receiveComplete
                (socket,data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                 (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
      reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map._0_1_ = 0;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&data,(char *)&reader);
      Json::Reader::Reader(&reader);
      bVar1 = Json::Reader::parse(&reader,data.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start + __new_size,&this->m_jsonContent
                                  ,true);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"parsing meta \'");
        local_178[0] = local_168;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,
                   data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + __new_size);
        poVar2 = std::operator<<(poVar2,(string *)local_178);
        poVar2 = std::operator<<(poVar2,"\'information failed : ");
        Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_158,&reader);
        poVar2 = std::operator<<(poVar2,(string *)&local_158);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)local_178);
      }
      Json::Reader::~Reader(&reader);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&data.super__Vector_base<char,_std::allocator<char>_>);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->m_binaryContent,__new_size);
      pBlock = (this->m_binaryContent).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      SocketNonblocking::receiveComplete
                (socket,pBlock,
                 (long)(this->m_binaryContent).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pBlock);
    }
  }
  return;
}

Assistant:

MetaInformation::MetaInformation(SocketNonblocking &socket, size_t size)
			: m_type(0)
			, m_jsonContent()
			, m_binaryContent()
		{
			int32_t typeBig;

			if (size<=sizeof(typeBig)) {
				std::cerr << __FUNCTION__ << ": invalid size" <<std::endl;
				return;
			}

			socket.receiveComplete(&typeBig, sizeof(typeBig));

			m_type = ntohl(typeBig);
			if(m_type==METAINFORMATION_JSON) {
				size_t dataSize = size-sizeof(m_type);
				std::vector < char > data(dataSize);
				socket.receiveComplete(&data[0], data.size());
				data.push_back('\0');

				Json::Reader reader;
				if(reader.parse(&data[0], &data[dataSize], m_jsonContent)==false) {
					std::cerr << "parsing meta '" << std::string(&data[0], dataSize) << "'information failed : " << reader.getFormattedErrorMessages() << std::endl;
				}

			} else {
				m_binaryContent.resize(size-sizeof(m_type));
				socket.receiveComplete(&m_binaryContent[0], m_binaryContent.size());
			}
		}